

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainEth1394.cpp
# Opt level: O0

void ComputeConfigCRC(void)

{
  _Setfill<char> _Var1;
  uint16_t uVar2;
  uint16_t uVar3;
  _Setw _Var4;
  ostream *poVar5;
  void *pvVar6;
  char *local_b0;
  __uint32_t local_98;
  __uint32_t local_94;
  quadlet_t model_desc [5];
  __uint32_t local_78;
  __uint32_t local_74;
  quadlet_t vendor_desc [4];
  __uint32_t local_58;
  __uint32_t local_54;
  quadlet_t root_dir [5];
  uint local_30;
  uint local_2c;
  uint bnum;
  uint bver;
  quadlet_t bus_info [4];
  uint16_t crc16Eth;
  uint16_t crc16;
  
  bnum = __bswap_32(0x31333934);
  bver = __bswap_32(0xffa000);
  bus_info[0] = __bswap_32(0xfa610e00);
  bus_info[1] = __bswap_32(7);
  std::ostream::operator<<(&std::cout,std::hex);
  for (local_2c = 0xe; local_2c < 0x10; local_2c = local_2c + 1) {
    poVar5 = std::operator<<((ostream *)&std::cout,"    // Version: ");
    if (local_2c == 0xe) {
      local_b0 = "Ethernet";
    }
    else {
      local_b0 = "Firewire";
    }
    poVar5 = std::operator<<(poVar5,local_b0);
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"    always @(*)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"    begin");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"        case (board_id)");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    for (local_30 = 0; local_30 < 0x10; local_30 = local_30 + 1) {
      bus_info[0] = __bswap_32(local_30 << 4 | 0xfa610e00 | local_2c);
      uVar2 = ComputeCRC16((uchar *)&bnum,0x10);
      poVar5 = std::operator<<((ostream *)&std::cout,"            4\'h");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,local_30);
      poVar5 = std::operator<<(poVar5,": info_crc = 16\'h");
      _Var4 = std::setw(4);
      poVar5 = std::operator<<(poVar5,_Var4);
      _Var1 = std::setfill<char>('0');
      poVar5 = std::operator<<(poVar5,_Var1._M_c);
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
      poVar5 = std::operator<<(poVar5,";");
      std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    }
    poVar5 = std::operator<<((ostream *)&std::cout,"        endcase");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
    poVar5 = std::operator<<((ostream *)&std::cout,"    end");
    std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  }
  local_58 = __bswap_32(0xc0083c0);
  local_54 = __bswap_32(0x3fa610e);
  root_dir[0] = __bswap_32(0x81000003);
  root_dir[1] = __bswap_32(0x17000001);
  root_dir[2] = __bswap_32(0x81000006);
  uVar2 = ComputeCRC16((uchar *)&local_58,0x14);
  root_dir[1] = __bswap_32(0x17000002);
  uVar3 = ComputeCRC16((uchar *)&local_58,0x14);
  poVar5 = std::operator<<((ostream *)&std::cout,"    Root Directory CRC (Rev 1,2): ");
  _Var4 = std::setw(4);
  poVar5 = std::operator<<(poVar5,_Var4);
  _Var1 = std::setfill<char>('0');
  poVar5 = std::operator<<(poVar5,_Var1._M_c);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
  poVar5 = std::operator<<(poVar5,", ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  local_78 = __bswap_32(0);
  local_74 = __bswap_32(0);
  vendor_desc[0] = __bswap_32(0x4a485520);
  vendor_desc[1] = __bswap_32(0x4c435352);
  uVar2 = ComputeCRC16((uchar *)&local_78,0x10);
  poVar5 = std::operator<<((ostream *)&std::cout,"    Vendor Descriptor CRC: ");
  _Var4 = std::setw(4);
  poVar5 = std::operator<<(poVar5,_Var4);
  model_desc[4]._3_1_ = std::setfill<char>('0');
  poVar5 = std::operator<<(poVar5,model_desc[4]._3_1_);
  pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar2);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  local_98 = __bswap_32(0);
  local_94 = __bswap_32(0);
  model_desc[0] = __bswap_32(0x46504741);
  model_desc[1] = __bswap_32(0x312f514c);
  model_desc[2] = __bswap_32(0x41000000);
  uVar2 = ComputeCRC16((uchar *)&local_98,0x14);
  model_desc[1] = __bswap_32(0x322f514c);
  uVar3 = ComputeCRC16((uchar *)&local_98,0x14);
  poVar5 = std::operator<<((ostream *)&std::cout,"    Model Descriptor CRC (Rev 1,2): ");
  _Var4 = std::setw(4);
  poVar5 = std::operator<<(poVar5,_Var4);
  _Var1 = std::setfill<char>('0');
  poVar5 = std::operator<<(poVar5,_Var1._M_c);
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,uVar2);
  poVar5 = std::operator<<(poVar5,", ");
  pvVar6 = (void *)std::ostream::operator<<(poVar5,uVar3);
  std::ostream::operator<<(pvVar6,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(&std::cout,std::dec);
  return;
}

Assistant:

void ComputeConfigCRC()
{
    uint16_t crc16, crc16Eth;
    quadlet_t bus_info[4];
    bus_info[0] = bswap_32(0x31333934);  // "1394"
    bus_info[1] = bswap_32(0x00ffa000);
    bus_info[2] = bswap_32(0xfa610e00);  // LCSR CID + BID + E/F
    bus_info[3] = bswap_32(0x00000007);  // Firmware version
    std::cout << std::hex;
    for (unsigned int bver = 0x0e; bver <= 0x0f; bver++) {
        std::cout << "    // Version: " << ((bver == 0x0e) ? "Ethernet" : "Firewire") << std::endl;
        std::cout << "    always @(*)" << std::endl;
        std::cout << "    begin" << std::endl;
        std::cout << "        case (board_id)" << std::endl;
        for (unsigned int bnum = 0; bnum < BoardIO::MAX_BOARDS; bnum++) {
            bus_info[2] = bswap_32(0xfa610e00|(bnum << 4)|bver);
            crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(bus_info), sizeof(bus_info));
            std::cout << "            4'h" << bnum << ": info_crc = 16'h"
                      << std::setw(4) << std::setfill('0') << crc16 << ";" << std::endl;
        }
        std::cout << "        endcase" << std::endl;
        std::cout << "    end" << std::endl;
    }
    quadlet_t root_dir[5];
    root_dir[0] = bswap_32(0x0c0083c0);
    root_dir[1] = bswap_32(0x03fa610e);
    root_dir[2] = bswap_32(0x81000003);
    root_dir[3] = bswap_32(0x17000001);
    root_dir[4] = bswap_32(0x81000006);
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(root_dir), sizeof(root_dir));
    root_dir[3] = bswap_32(0x17000002);
    crc16Eth = ComputeCRC16(reinterpret_cast<unsigned char *>(root_dir), sizeof(root_dir));
    std::cout << "    Root Directory CRC (Rev 1,2): " << std::setw(4) << std::setfill('0') << crc16
              << ", " << crc16Eth << std::endl;
    quadlet_t vendor_desc[4];
    vendor_desc[0] = bswap_32(0x00000000);
    vendor_desc[1] = bswap_32(0x00000000);
    vendor_desc[2] = bswap_32(0x4A485520);  // "JHU "
    vendor_desc[3] = bswap_32(0x4C435352);  // "LCSR"
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(vendor_desc), sizeof(vendor_desc));
    std::cout << "    Vendor Descriptor CRC: " << std::setw(4) << std::setfill('0') << crc16
              << std::endl;
    quadlet_t model_desc[5];
    model_desc[0] = bswap_32(0x00000000);
    model_desc[1] = bswap_32(0x00000000);
    model_desc[2] = bswap_32(0x46504741);   // "FPGA"
    model_desc[3] = bswap_32(0x312F514C);   // "1/QL"
    model_desc[4] = bswap_32(0x41000000);   // "A"
    crc16 = ComputeCRC16(reinterpret_cast<unsigned char *>(model_desc), sizeof(model_desc));
    model_desc[3] = bswap_32(0x322F514C);   // "2/QL"
    crc16Eth = ComputeCRC16(reinterpret_cast<unsigned char *>(model_desc), sizeof(model_desc));
    std::cout << "    Model Descriptor CRC (Rev 1,2): " << std::setw(4) << std::setfill('0') << crc16
              << ", " << crc16Eth << std::endl;
    std::cout << std::dec;
}